

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O3

_Bool react_to_slay(object *obj,monster_conflict *mon)

{
  _Bool _Var1;
  angband_constants *paVar2;
  long lVar3;
  ulong uVar4;
  
  if (obj->slays == (_Bool *)0x0) {
    return false;
  }
  if (z_info->slay_max != '\0') {
    lVar3 = 0;
    uVar4 = 0;
    paVar2 = z_info;
    do {
      if ((obj->slays[uVar4] == true) &&
         (_Var1 = react_to_specific_slay((slay_conflict *)((long)&slays->code + lVar3),mon),
         paVar2 = z_info, _Var1)) {
        return true;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x38;
    } while (uVar4 < paVar2->slay_max);
  }
  return false;
}

Assistant:

bool react_to_slay(struct object *obj, const struct monster *mon)
{
	int i;

	if (!obj->slays) return false;

	for (i = 0; i < z_info->slay_max; i++) {
		struct slay *s = &slays[i];
		if (obj->slays[i] && react_to_specific_slay(s, mon)) {
			return true;
		}
	}

	return false;
}